

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ManAppendMuxReal(Gia_Man_t *p,int iLitC,int iLit1,int iLit0)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  pGVar5 = Gia_ManAppendObj(p);
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2ee,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLit0 < 0) {
LAB_0020a97c:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar8 = (uint)iLit0 >> 1;
  iVar1 = p->nObjs;
  if (iVar1 <= (int)uVar8) {
    __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2ef,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLit1 < 0) goto LAB_0020a97c;
  uVar6 = (uint)iLit1 >> 1;
  if (iVar1 <= (int)uVar6) {
    __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2f0,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (iLitC < 0) goto LAB_0020a97c;
  uVar3 = (uint)iLitC >> 1;
  if (iVar1 <= (int)uVar3) {
    __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2f1,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar8 == uVar6) {
    __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2f2,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar3 == uVar8) {
    __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2f3,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (uVar3 == uVar6) {
    __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2f4,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  if (((iLit1 & 1U) != 0) && ((p->vHTable).nSize != 0)) {
    __assert_fail("!Vec_IntSize(&p->vHTable) || !Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x2f5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
  }
  pGVar7 = p->pObjs;
  iVar4 = (int)pGVar5;
  if (uVar8 < uVar6) {
    if (pGVar7 + iVar1 <= pGVar5 || pGVar5 < pGVar7) goto LAB_0020a95d;
    uVar2 = *(ulong *)pGVar5;
    uVar9 = (ulong)((iLit0 & 1U) << 0x1d |
                   ((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar8 & 0x1fffffff);
    *(ulong *)pGVar5 = uVar9 | uVar2 & 0xffffffffc0000000;
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_0020a95d;
    *(ulong *)pGVar5 =
         (ulong)(iLit1 & 1) << 0x3d |
         uVar9 | uVar2 & 0xc0000000c0000000 |
         (ulong)(((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) << 0x20;
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_0020a95d;
  }
  else {
    if (pGVar7 + iVar1 <= pGVar5 || pGVar5 < pGVar7) goto LAB_0020a95d;
    uVar2 = *(ulong *)pGVar5;
    uVar9 = (ulong)(((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar8 & 0x1fffffff) << 0x20;
    uVar10 = (ulong)(iLit0 & 1) << 0x3d;
    *(ulong *)pGVar5 = uVar10 | uVar2 & 0xc0000000ffffffff | uVar9;
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_0020a95d;
    *(ulong *)pGVar5 =
         (ulong)((iLit1 & 1U) << 0x1d) | uVar10 | uVar2 & 0xc0000000c0000000 | uVar9 |
         (ulong)(((uint)(iVar4 - (int)pGVar7) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) goto LAB_0020a95d;
    iLitC = iLitC ^ 1;
  }
  p->pMuxes[(int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * -0x55555555] = iLitC;
  p->nMuxes = p->nMuxes + 1;
  pGVar7 = p->pObjs;
  if ((pGVar7 <= pGVar5) && (pGVar5 < pGVar7 + p->nObjs)) {
    return (int)((ulong)((long)pGVar5 - (long)pGVar7) >> 2) * 0x55555556;
  }
LAB_0020a95d:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Gia_ManAppendMuxReal( Gia_Man_t * p, int iLitC, int iLit1, int iLit0 )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( p->pMuxes != NULL );
    assert( iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p) );
    assert( iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p) );
    assert( iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p) );
    assert( Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0) );
    assert( Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1) );
    assert( !Vec_IntSize(&p->vHTable) || !Abc_LitIsCompl(iLit1) );
    if ( Abc_Lit2Var(iLit0) < Abc_Lit2Var(iLit1) )
    {
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit1));
        p->pMuxes[Gia_ObjId(p, pObj)] = iLitC;
    }
    else
    {
        pObj->iDiff1  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit0));
        pObj->fCompl1 = (unsigned)(Abc_LitIsCompl(iLit0));
        pObj->iDiff0  = (unsigned)(Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit1));
        pObj->fCompl0 = (unsigned)(Abc_LitIsCompl(iLit1));
        p->pMuxes[Gia_ObjId(p, pObj)] = Abc_LitNot(iLitC);
    }
    p->nMuxes++;
    return Gia_ObjId( p, pObj ) << 1;
}